

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

void LinkedList_PrependEntry
               (LinkedList **start,void *toAdd,FAudioMutex lock,FAudioMallocFunc pMalloc)

{
  LinkedList *pLVar1;
  
  pLVar1 = (LinkedList *)(*pMalloc)(0x10);
  pLVar1->entry = toAdd;
  FAudio_PlatformLockMutex(lock);
  pLVar1->next = *start;
  *start = pLVar1;
  FAudio_PlatformUnlockMutex(lock);
  return;
}

Assistant:

void LinkedList_PrependEntry(
	LinkedList **start,
	void* toAdd,
	FAudioMutex lock,
	FAudioMallocFunc pMalloc
) {
	LinkedList *newEntry;
	newEntry = (LinkedList*) pMalloc(sizeof(LinkedList));
	newEntry->entry = toAdd;
	FAudio_PlatformLockMutex(lock);
	newEntry->next = *start;
	*start = newEntry;
	FAudio_PlatformUnlockMutex(lock);
}